

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.cpp
# Opt level: O1

void __thiscall Table::createNewRoot(Table *this,uint32_t rightChildPageNum)

{
  uint32_t uVar1;
  char *node;
  char *node_00;
  uint32_t *puVar2;
  
  node = Pager::getPage(this->pager,this->rootPageNum);
  Pager::getPage(this->pager,rightChildPageNum);
  uVar1 = Pager::getUnusedPageNum(this->pager);
  node_00 = Pager::getPage(this->pager,uVar1);
  memcpy(node_00,node,0x1000);
  set_node_root(node_00,false);
  initialize_internal_node(node);
  set_node_root(node,true);
  puVar2 = internal_node_num_keys(node);
  *puVar2 = 1;
  puVar2 = internal_node_child(node,0);
  *puVar2 = uVar1;
  uVar1 = get_node_max_key(node_00);
  puVar2 = internal_node_key(node,0);
  *puVar2 = uVar1;
  puVar2 = internal_node_right_child(node);
  *puVar2 = rightChildPageNum;
  return;
}

Assistant:

void Table::createNewRoot(uint32_t rightChildPageNum) {
	char *root = pager->getPage(rootPageNum);
	char *rightChild = pager->getPage(rightChildPageNum);
	uint32_t leftChildPageNum = pager->getUnusedPageNum();
	char *leftChild = pager->getPage(leftChildPageNum);

	memcpy(leftChild, root, PAGE_SIZE);
	set_node_root(leftChild, false);

	initialize_internal_node(root);
	set_node_root(root, true);
	*internal_node_num_keys(root) = 1;
	*internal_node_child(root, 0) = leftChildPageNum;
	uint32_t leftChildMaxKey = get_node_max_key(leftChild);
	*internal_node_key(root, 0) = leftChildMaxKey;
	*internal_node_right_child(root) = rightChildPageNum;

}